

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O1

_Bool flags_clear(bitflag *flags,size_t size,...)

{
  char in_AL;
  _Bool _Var1;
  undefined8 in_RCX;
  void **ppvVar2;
  undefined8 in_RDX;
  ulong uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  void **ppvVar4;
  uint uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uint local_e8;
  void *local_c8 [2];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8._0_4_ = (int)in_RDX;
  if ((int)local_b8 == 0) {
    _Var1 = false;
  }
  else {
    local_e8 = 0x18;
    _Var1 = false;
    ppvVar4 = &args[0].overflow_arg_area;
    do {
      uVar5 = (int)local_b8 - 1;
      uVar3 = (ulong)(long)(int)uVar5 >> 3;
      if (size <= uVar3) {
        local_b8 = in_RDX;
        local_b0 = in_RCX;
        local_a8 = in_R8;
        local_a0 = in_R9;
        __assert_fail("flag_offset < size",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-bitflag.c"
                      ,0x1db,"_Bool flags_clear(bitflag *, const size_t, ...)");
      }
      if ((flags[uVar3] >> (uVar5 & 7) & 1) != 0) {
        _Var1 = true;
      }
      flags[uVar3] = ~(byte)(1 << ((byte)uVar5 & 7)) & flags[uVar3];
      if (local_e8 < 0x29) {
        uVar3 = (ulong)local_e8;
        local_e8 = local_e8 + 8;
        ppvVar2 = ppvVar4;
        ppvVar4 = (void **)((long)local_c8 + uVar3);
      }
      else {
        ppvVar2 = ppvVar4 + 1;
      }
      local_b8._0_4_ = *(int *)ppvVar4;
      ppvVar4 = ppvVar2;
    } while ((int)local_b8 != 0);
  }
  return _Var1;
}

Assistant:

bool flags_clear(bitflag *flags, const size_t size, ...)
{
	size_t flag_offset;
	int flag_binary;
	int f;
	va_list args;
	bool delta = false;

	va_start(args, size);

	/* Process each flag in the va-args */
	for (f = va_arg(args, int); f != FLAG_END; f = va_arg(args, int)) {
		flag_offset = FLAG_OFFSET(f);
		flag_binary = FLAG_BINARY(f);

		assert(flag_offset < size);

		/* flag_has() */
		if (flags[flag_offset] & flag_binary) delta = true;

		/* flag_off() */
		flags[flag_offset] &= ~flag_binary;
	}

	va_end(args);

	return delta;
}